

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilu_ssnode_dfs.c
# Opt level: O2

int ilu_ssnode_dfs(int jcol,int kcol,int_t *asub,int_t *xa_begin,int_t *xa_end,int *marker,
                  GlobalLU_t *Glu)

{
  int iVar1;
  int_t iVar2;
  int_t *piVar3;
  int iVar4;
  long lVar5;
  int next;
  long lVar6;
  long lVar7;
  int_t nzlmax;
  int *local_78;
  long local_70;
  long local_68;
  int_t *local_60;
  int *local_58;
  long local_50;
  int_t *local_48;
  int *local_40;
  long local_38;
  
  local_58 = Glu->xsup;
  local_78 = Glu->supno;
  piVar3 = Glu->lsub;
  local_60 = Glu->xlsub;
  nzlmax = Glu->nzlmax;
  lVar6 = (long)jcol;
  local_68 = (long)local_78[lVar6];
  iVar4 = local_78[lVar6] + 1;
  local_78[lVar6] = iVar4;
  next = local_60[lVar6];
  local_50 = (long)kcol;
  local_70 = lVar6;
  local_48 = xa_begin;
  local_40 = marker;
  do {
    if (local_50 < lVar6) {
      if (jcol < kcol) {
        for (; local_70 < local_50; local_70 = local_70 + 1) {
          local_60[local_70 + 1] = next;
        }
      }
      local_58[local_68 + 2] = kcol + 1;
      local_78[local_50 + 1] = iVar4;
      local_60[local_50 + 1] = next;
      return 0;
    }
    local_38 = lVar6;
    for (lVar7 = (long)local_48[lVar6]; lVar7 < xa_end[lVar6]; lVar7 = lVar7 + 1) {
      iVar1 = asub[lVar7];
      if (marker[iVar1] != kcol) {
        marker[iVar1] = kcol;
        lVar5 = (long)next;
        next = next + 1;
        piVar3[lVar5] = iVar1;
        if (nzlmax <= next) {
          iVar2 = sLUMemXpand(jcol,next,LSUB,&nzlmax,Glu);
          if (iVar2 != 0) {
            return iVar2;
          }
          piVar3 = Glu->lsub;
          marker = local_40;
          lVar6 = local_38;
        }
      }
    }
    local_78[lVar6] = iVar4;
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

int
ilu_ssnode_dfs(
	   const int  jcol,	    /* in - start of the supernode */
	   const int  kcol,	    /* in - end of the supernode */
	   const int_t  *asub,	    /* in */
	   const int_t  *xa_begin,    /* in */
	   const int_t  *xa_end,	    /* in */
	   int	      *marker,	    /* modified */
	   GlobalLU_t *Glu	    /* modified */
	   )
{
    int_t i, k, nextl, mem_error;
    int   nsuper, krow, kmark;
    int   *xsup, *supno;
    int_t *lsub, *xlsub;
    int_t nzlmax;

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    nzlmax  = Glu->nzlmax;

    nsuper = ++supno[jcol];	/* Next available supernode number */
    nextl = xlsub[jcol];

    for (i = jcol; i <= kcol; i++)
    {
	/* For each nonzero in A[*,i] */
	for (k = xa_begin[i]; k < xa_end[i]; k++)
	{
	    krow = asub[k];
	    kmark = marker[krow];
	    if ( kmark != kcol )
	    { /* First time visit krow */
		marker[krow] = kcol;
		lsub[nextl++] = krow;
		if ( nextl >= nzlmax )
		{
		    if ( (mem_error = sLUMemXpand(jcol, nextl, LSUB, &nzlmax,
			    Glu)) != 0)
			return (mem_error);
		    lsub = Glu->lsub;
		}
	    }
	}
	supno[i] = nsuper;
    }

    /* Supernode > 1 */
    if ( jcol < kcol )
	for (i = jcol+1; i <= kcol; i++) xlsub[i] = nextl;

    xsup[nsuper+1] = kcol + 1;
    supno[kcol+1]  = nsuper;
    xlsub[kcol+1]  = nextl;

    return 0;
}